

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O3

QString * __thiscall QTextCursor::selectedText(QString *__return_storage_ptr__,QTextCursor *this)

{
  int iVar1;
  QTextDocumentPrivate *pQVar2;
  int iVar3;
  int iVar4;
  QTextTable *pQVar5;
  int iVar6;
  int col;
  QTextCursorPrivate *pQVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long in_FS_OFFSET;
  QString *text;
  int num_cols;
  int num_rows;
  int col_start;
  int row_start;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  QString local_60;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = (this->d).d.ptr;
  if (((pQVar7 == (QTextCursorPrivate *)0x0) ||
      (pQVar2 = pQVar7->priv, pQVar2 == (QTextDocumentPrivate *)0x0)) ||
     (pQVar7->position == pQVar7->anchor)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_004bd586;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    local_60.d.d = (pQVar2->text).d.d;
    local_60.d.ptr = (pQVar2->text).d.ptr;
    local_60.d.size = (pQVar2->text).d.size;
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_60.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_60.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pQVar7 = (this->d).d.ptr;
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    pQVar5 = QTextCursorPrivate::complexSelectionTable(pQVar7);
    if (pQVar5 == (QTextTable *)0x0) {
      pQVar7 = (this->d).d.ptr;
      if (pQVar7->priv == (QTextDocumentPrivate *)0x0) {
        iVar6 = -1;
        iVar8 = -1;
      }
      else {
        iVar1 = pQVar7->position;
        iVar8 = pQVar7->adjusted_anchor;
        iVar6 = iVar8;
        if (iVar1 < iVar8) {
          iVar6 = iVar1;
        }
        if (iVar8 < iVar1) {
          iVar8 = iVar1;
        }
      }
      getText(__return_storage_ptr__,pQVar7->priv,&local_60,iVar6,iVar8);
    }
    else {
      local_64 = -0x55555556;
      local_68 = -0x55555556;
      local_6c = -0x55555556;
      local_70 = -0x55555556;
      selectedTableCells(this,&local_64,&local_6c,&local_68,&local_70);
      iVar6 = local_68;
      iVar8 = local_70;
      if (0 < local_6c) {
        iVar1 = local_6c + local_64;
        iVar10 = local_70 + local_68;
        col = local_64;
        do {
          iVar9 = iVar6;
          if (0 < iVar8) {
            do {
              local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              QTextTable::cellAt((QTextTable *)local_48,(int)pQVar5,col);
              iVar3 = QTextTableCell::rowSpan((QTextTableCell *)local_48);
              iVar4 = QTextTableCell::columnSpan((QTextTableCell *)local_48);
              if (((iVar3 == 1) ||
                  (iVar3 = QTextTableCell::row((QTextTableCell *)local_48), iVar3 == col)) &&
                 ((iVar4 == 1 ||
                  (iVar3 = QTextTableCell::column((QTextTableCell *)local_48), iVar9 == iVar3)))) {
                pQVar2 = ((this->d).d.ptr)->priv;
                iVar3 = QTextTableCell::firstPosition((QTextTableCell *)local_48);
                iVar4 = QTextTableCell::lastPosition((QTextTableCell *)local_48);
                getText(__return_storage_ptr__,pQVar2,&local_60,iVar3,iVar4);
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 < iVar10);
          }
          col = col + 1;
        } while (col < iVar1);
      }
    }
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_004bd586:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QTextCursor::selectedText() const
{
    if (!d || !d->priv || d->position == d->anchor)
        return QString();

    const QString docText = d->priv->buffer();
    QString text;

    QTextTable *table = d->complexSelectionTable();
    if (table) {
        int row_start, col_start, num_rows, num_cols;
        selectedTableCells(&row_start, &num_rows, &col_start, &num_cols);

        Q_ASSERT(row_start != -1);
        for (int r = row_start; r < row_start + num_rows; ++r) {
            for (int c = col_start; c < col_start + num_cols; ++c) {
                QTextTableCell cell = table->cellAt(r, c);
                int rspan = cell.rowSpan();
                int cspan = cell.columnSpan();
                if (rspan != 1) {
                    int cr = cell.row();
                    if (cr != r)
                        continue;
                }
                if (cspan != 1) {
                    int cc = cell.column();
                    if (cc != c)
                        continue;
                }

                getText(text, d->priv, docText, cell.firstPosition(), cell.lastPosition());
            }
        }
    } else {
        getText(text, d->priv, docText, selectionStart(), selectionEnd());
    }

    return text;
}